

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdot.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  float *pfVar1;
  uint uVar2;
  double dVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [15];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  unkuint9 Var17;
  undefined1 auVar18 [11];
  undefined1 auVar19 [13];
  undefined1 auVar20 [14];
  undefined1 auVar21 [11];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  uint6 uVar29;
  int iVar30;
  int iVar31;
  size_t __i;
  long lVar32;
  pointer __s;
  pointer __s_00;
  undefined8 *puVar33;
  undefined8 *puVar34;
  vector<block_q4_0,_std::allocator<block_q4_0>_> *pvVar35;
  long lVar36;
  ulong uVar37;
  pointer paVar38;
  pointer paVar39;
  uint8_t *puVar40;
  pointer pfVar41;
  long lVar42;
  value_type *__val_1;
  long lVar43;
  value_type *__val;
  bool bVar44;
  float mean;
  float fVar45;
  float fVar46;
  double dVar47;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar48 [16];
  float fVar49;
  undefined4 uVar50;
  float fVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  undefined1 auVar55 [15];
  undefined1 auVar56 [16];
  ushort uVar57;
  undefined1 auVar58 [15];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  bool local_1516;
  int local_1514;
  block_q8_0 *y;
  double local_1508;
  double local_1500;
  double local_14f8;
  double local_14f0;
  double local_14e8;
  float result;
  double local_14d0;
  double local_14c8;
  double local_14c0;
  undefined8 local_14b8;
  undefined4 uStack_14ac;
  undefined8 *local_14a0;
  vector<block_q4_0,_std::allocator<block_q4_0>_> q40;
  vector<block_q4_1,_std::allocator<block_q4_1>_> q41;
  vector<float,_std::allocator<float>_> x1;
  double local_1418;
  double local_1410;
  vector<float,_std::allocator<float>_> y1;
  mt19937 rndm;
  
  local_1514 = 10;
  if (1 < argc) {
    local_1514 = atoi(argv[1]);
  }
  local_1516 = true;
  bVar44 = true;
  if (2 < argc) {
    iVar30 = atoi(argv[2]);
    bVar44 = iVar30 == 0;
  }
  if (3 < argc) {
    iVar30 = atoi(argv[3]);
    local_1516 = iVar30 == 0;
  }
  if (bVar44 || local_1516 != false) {
    rndm._M_x[0] = 0x4d2;
    lVar32 = 1;
    uVar37 = 0x4d2;
    do {
      uVar37 = (ulong)(((uint)(uVar37 >> 0x1e) ^ (uint)uVar37) * 0x6c078965 + (int)lVar32);
      rndm._M_x[lVar32] = uVar37;
      lVar32 = lVar32 + 1;
    } while (lVar32 != 0x270);
    rndm._M_p = 0x270;
    x1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    x1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    x1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    __s = (pointer)operator_new(0x100000);
    x1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         __s;
    x1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         __s;
    x1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = __s + 0x40000;
    memset(__s,0,0x100000);
    y1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    y1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    y1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    x1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         __s + 0x40000;
    __s_00 = (pointer)operator_new(0x100000);
    y1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         __s_00;
    y1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         __s_00;
    y1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = __s_00 + 0x40000;
    memset(__s_00,0,0x100000);
    y1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         __s_00 + 0x40000;
    local_14a0 = (undefined8 *)ggml_get_type_traits_cpu(local_1516 ^ 3);
    q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (local_1516 == false) {
      std::vector<block_q4_1,_std::allocator<block_q4_1>_>::resize(&q41,0x2000);
    }
    else {
      std::vector<block_q4_0,_std::allocator<block_q4_0>_>::resize(&q40,0x2000);
    }
    puVar33 = (undefined8 *)operator_new(0x48000);
    puVar33[2] = 0;
    puVar33[3] = 0;
    *puVar33 = 0;
    puVar33[1] = 0;
    *(undefined4 *)(puVar33 + 4) = 0;
    lVar32 = 0x24;
    do {
      *(undefined4 *)((long)puVar33 + lVar32 + 0x20) = *(undefined4 *)(puVar33 + 4);
      uVar14 = *puVar33;
      uVar15 = puVar33[1];
      uVar16 = puVar33[3];
      puVar34 = (undefined8 *)((long)puVar33 + lVar32 + 0x10);
      *puVar34 = puVar33[2];
      puVar34[1] = uVar16;
      *(undefined8 *)((long)puVar33 + lVar32) = uVar14;
      ((undefined8 *)((long)puVar33 + lVar32))[1] = uVar15;
      lVar32 = lVar32 + 0x24;
    } while (lVar32 != 0x48000);
    dVar47 = 0.0;
    fVar49 = 0.0;
    local_1418 = 0.0;
    local_14f0 = 0.0;
    local_14c8 = 0.0;
    local_1508 = 0.0;
    local_14d0 = 0.0;
    local_1500 = 0.0;
    local_14f8 = 0.0;
    local_14c0 = 0.0;
    if (0 < local_1514) {
      local_14c0 = 0.0;
      iVar30 = 0;
      local_14f8 = 0.0;
      local_1500 = 0.0;
      local_14d0 = 0.0;
      local_1508 = 0.0;
      local_14c8 = 0.0;
      local_14f0 = 0.0;
      local_1418 = 0.0;
      local_1410 = 0.0;
      do {
        fillRandomGaussianFloats(&x1,&rndm,fVar49);
        fillRandomGaussianFloats(&y1,&rndm,mean);
        lVar32 = 0;
        do {
          local_14c0 = local_14c0 + (double)(__s[lVar32] * __s_00[lVar32]);
          lVar32 = lVar32 + 1;
        } while (lVar32 != 0x40000);
        pvVar35 = (vector<block_q4_0,_std::allocator<block_q4_0>_> *)&q41;
        if (local_1516 != false) {
          pvVar35 = &q40;
        }
        (*(code *)*local_14a0)
                  (__s,(((_Vector_base<block_q4_1,_std::allocator<block_q4_1>_> *)
                        &pvVar35->super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>)->
                       _M_impl).super__Vector_impl_data._M_start,0x40000);
        lVar32 = std::chrono::_V2::system_clock::now();
        if (local_1516 == false) {
          local_14e8 = 0.0;
          iVar31 = 0;
          paVar39 = q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pfVar41 = __s_00;
          do {
            fVar49 = 0.0;
            lVar42 = 0;
            fVar51 = 0.0;
            do {
              uVar2 = *(uint *)(paVar39->qs + lVar42);
              fVar51 = fVar51 + *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                          (ulong)(uVar2 >> 0x1c) * 4) * pfVar41[lVar42 * 2 + 7] +
                                *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                          (uVar2 >> 0x16 & 0x3c)) * pfVar41[lVar42 * 2 + 6] +
                                *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                          (uVar2 >> 0x12 & 0x3c)) * pfVar41[lVar42 * 2 + 5] +
                                *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                          (uVar2 >> 0xe & 0x3c)) * pfVar41[lVar42 * 2 + 4] +
                                *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                          (uVar2 >> 10 & 0x3c)) * pfVar41[lVar42 * 2 + 3] +
                                *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                          (uVar2 >> 6 & 0x3c)) * pfVar41[lVar42 * 2 + 2] +
                                *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                          (ulong)(uVar2 & 0xf) * 4) * pfVar41[lVar42 * 2] +
                                *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                          (uVar2 >> 2 & 0x3c)) * pfVar41[lVar42 * 2 + 1];
              fVar49 = fVar49 + pfVar41[lVar42 * 2] + pfVar41[lVar42 * 2 + 1] +
                                pfVar41[lVar42 * 2 + 2] + pfVar41[lVar42 * 2 + 3] +
                                pfVar41[lVar42 * 2 + 4] + pfVar41[lVar42 * 2 + 5] +
                                pfVar41[lVar42 * 2 + 6] + pfVar41[lVar42 * 2 + 7];
              lVar42 = lVar42 + 4;
            } while (lVar42 != 0x10);
            pfVar41 = pfVar41 + 0x20;
            local_14e8 = local_14e8 + (double)(fVar51 * paVar39->d + fVar49 * paVar39->m);
            paVar39 = paVar39 + 1;
            iVar31 = iVar31 + 1;
          } while (iVar31 != 0x2000);
        }
        else {
          local_14e8 = 0.0;
          iVar31 = 0;
          paVar38 = q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pfVar41 = __s_00;
          do {
            fVar49 = 0.0;
            lVar42 = 0;
            do {
              uVar2 = *(uint *)(paVar38->qs + lVar42);
              fVar49 = fVar49 + pfVar41[lVar42 * 2 + 7] *
                                *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                          (ulong)(uVar2 >> 0x1c) * 4) +
                                pfVar41[lVar42 * 2 + 6] *
                                *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                          (uVar2 >> 0x16 & 0x3c)) +
                                pfVar41[lVar42 * 2 + 5] *
                                *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                          (uVar2 >> 0x12 & 0x3c)) +
                                pfVar41[lVar42 * 2 + 4] *
                                *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                          (uVar2 >> 0xe & 0x3c)) +
                                pfVar41[lVar42 * 2 + 3] *
                                *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                          (uVar2 >> 10 & 0x3c)) +
                                pfVar41[lVar42 * 2 + 2] *
                                *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                          (uVar2 >> 6 & 0x3c)) +
                                pfVar41[lVar42 * 2] *
                                *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                          (ulong)(uVar2 & 0xf) * 4) +
                                pfVar41[lVar42 * 2 + 1] *
                                *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                          (uVar2 >> 2 & 0x3c));
              lVar42 = lVar42 + 4;
            } while (lVar42 != 0x10);
            pfVar41 = pfVar41 + 0x20;
            local_14e8 = local_14e8 + (double)(paVar38->d * fVar49);
            paVar38 = paVar38 + 1;
            iVar31 = iVar31 + 1;
          } while (iVar31 != 0x2000);
        }
        lVar42 = std::chrono::_V2::system_clock::now();
        dVar47 = (double)(lVar42 - lVar32) * 0.001;
        lVar32 = std::chrono::_V2::system_clock::now();
        if (bVar44) {
          puVar34 = (undefined8 *)ggml_get_type_traits_cpu(*(undefined4 *)(local_14a0 + 2));
          (*(code *)*puVar34)(__s_00,puVar33,0x40000);
          pvVar35 = (vector<block_q4_0,_std::allocator<block_q4_0>_> *)&q41;
          if (local_1516 != false) {
            pvVar35 = &q40;
          }
          (*(code *)local_14a0[1])
                    (0x40000,&result,0,
                     (((_Vector_base<block_q4_1,_std::allocator<block_q4_1>_> *)
                      &pvVar35->super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>)->
                     _M_impl).super__Vector_impl_data._M_start,0,puVar33,0,1);
        }
        else {
          lVar43 = 0;
          pfVar41 = __s_00;
          lVar42 = (long)puVar33 + 4;
          do {
            lVar36 = 0;
            fVar49 = 0.0;
            do {
              fVar51 = ABS(pfVar41[lVar36]);
              if (ABS(pfVar41[lVar36]) <= fVar49) {
                fVar51 = fVar49;
              }
              lVar36 = lVar36 + 1;
              fVar49 = fVar51;
            } while (lVar36 != 0x20);
            fVar51 = fVar51 / 127.0;
            *(float *)((long)puVar33 + lVar43 * 0x24) = fVar51;
            fVar49 = (float)(-(uint)(fVar51 != 0.0) & (uint)(1.0 / fVar51));
            lVar36 = 0;
            do {
              pfVar1 = pfVar41 + lVar36;
              fVar51 = *pfVar1;
              fVar46 = pfVar1[1];
              fVar45 = pfVar1[2];
              local_14b8._0_4_ = roundf(pfVar1[3] * fVar49);
              local_14b8._4_4_ = extraout_XMM0_Db;
              fVar45 = roundf(fVar45 * fVar49);
              uStack_14ac = local_14b8._4_4_;
              local_14b8 = (double)CONCAT44((float)local_14b8,fVar45);
              fVar51 = roundf(fVar51 * fVar49);
              fVar46 = roundf(fVar46 * fVar49);
              auVar48._0_4_ = (int)fVar51;
              auVar48._4_4_ = (int)fVar46;
              auVar48._8_4_ = (int)SUB84(local_14b8,0);
              auVar48._12_4_ = (int)(float)((ulong)local_14b8 >> 0x20);
              auVar48 = packssdw(auVar48,auVar48);
              auVar48 = packsswb(auVar48,auVar48);
              *(int *)(lVar42 + lVar36) = auVar48._0_4_;
              lVar36 = lVar36 + 4;
            } while (lVar36 != 0x20);
            lVar43 = lVar43 + 1;
            pfVar41 = pfVar41 + 0x20;
            lVar42 = lVar42 + 0x24;
          } while (lVar43 != 0x2000);
          puVar40 = (q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                     super__Vector_impl_data._M_start)->qs;
          result = 0.0;
          lVar43 = 0;
          lVar42 = (long)puVar33 + 4;
          do {
            iVar31 = 0;
            iVar52 = 0;
            iVar53 = 0;
            iVar54 = 0;
            lVar36 = 0;
            do {
              uVar2 = *(uint *)(puVar40 + lVar36);
              auVar58 = ZEXT415(uVar2) & DAT_00103050._0_15_;
              Var17 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar58[3]);
              auVar25._9_6_ = 0;
              auVar25._0_9_ = Var17;
              auVar18._1_10_ = SUB1510(auVar25 << 0x30,5);
              auVar18[0] = auVar58[2];
              auVar26._11_4_ = 0;
              auVar26._0_11_ = auVar18;
              auVar19._1_12_ = SUB1512(auVar26 << 0x20,3);
              auVar19[0] = auVar58[1];
              uVar57 = CONCAT11(0,auVar58[0]);
              auVar55._2_13_ = auVar19;
              auVar55._0_2_ = uVar57;
              auVar7._10_2_ = 0;
              auVar7._0_10_ = auVar55._0_10_;
              auVar7._12_2_ = (short)Var17;
              uVar29 = CONCAT42(auVar7._10_4_,auVar18._0_2_);
              auVar20._6_8_ = 0;
              auVar20._0_6_ = uVar29;
              auVar62._0_4_ = uVar57 - 8;
              auVar62._4_4_ = (int)CONCAT82(SUB148(auVar20 << 0x40,6),auVar19._0_2_) + -8;
              auVar62._8_4_ = (int)uVar29 + -8;
              auVar62._12_4_ = (auVar7._10_4_ >> 0x10) - 8;
              auVar55 = ZEXT415(CONCAT22((ushort)(uVar2 >> 0x14),(ushort)uVar2 >> 4)) &
                        DAT_00103070._0_15_;
              Var17 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar55[3]);
              auVar27._9_6_ = 0;
              auVar27._0_9_ = Var17;
              auVar21._1_10_ = SUB1510(auVar27 << 0x30,5);
              auVar21[0] = auVar55[2];
              auVar28._11_4_ = 0;
              auVar28._0_11_ = auVar21;
              auVar58[2] = auVar55[1];
              auVar58._0_2_ = auVar55._0_2_;
              auVar58._3_12_ = SUB1512(auVar28 << 0x20,3);
              auVar13._2_13_ = auVar58._2_13_;
              auVar13._0_2_ = auVar55._0_2_ & 0xff;
              auVar4._10_2_ = 0;
              auVar4._0_10_ = auVar13._0_10_;
              auVar4._12_2_ = (short)Var17;
              uVar29 = CONCAT42(auVar4._10_4_,auVar21._0_2_);
              auVar22._6_8_ = 0;
              auVar22._0_6_ = uVar29;
              auVar10._4_2_ = auVar58._2_2_;
              auVar10._0_4_ = auVar13._0_4_;
              auVar10._6_8_ = SUB148(auVar22 << 0x40,6);
              auVar56._0_4_ = (auVar13._0_4_ & 0xffff) - 8;
              auVar56._4_4_ = auVar10._4_4_ + -8;
              auVar56._8_4_ = (int)uVar29 + -8;
              auVar56._12_4_ = (auVar4._10_4_ >> 0x10) - 8;
              auVar59._8_8_ = 0;
              auVar59._0_8_ = *(ulong *)(lVar42 + lVar36 * 2);
              auVar48 = psllw(auVar59,8);
              auVar48 = psraw(auVar48,8);
              auVar5._10_2_ = 0;
              auVar5._0_10_ = auVar48._0_10_;
              auVar5._12_2_ = auVar48._6_2_;
              auVar8._8_2_ = auVar48._4_2_;
              auVar8._0_8_ = auVar48._0_8_;
              auVar8._10_4_ = auVar5._10_4_;
              auVar23._6_8_ = 0;
              auVar23._0_6_ = auVar8._8_6_;
              auVar11._4_2_ = auVar48._2_2_;
              auVar11._0_4_ = auVar48._0_4_;
              auVar11._6_8_ = SUB148(auVar23 << 0x40,6);
              auVar61._0_4_ = auVar48._0_4_ & 0xffff;
              auVar61._4_10_ = auVar11._4_10_;
              auVar61._14_2_ = 0;
              auVar62 = pmaddwd(auVar61,auVar62);
              auVar48 = psraw(auVar59,8);
              auVar6._10_2_ = 0;
              auVar6._0_10_ = auVar48._0_10_;
              auVar6._12_2_ = auVar48._6_2_;
              auVar9._8_2_ = auVar48._4_2_;
              auVar9._0_8_ = auVar48._0_8_;
              auVar9._10_4_ = auVar6._10_4_;
              auVar24._6_8_ = 0;
              auVar24._0_6_ = auVar9._8_6_;
              auVar12._4_2_ = auVar48._2_2_;
              auVar12._0_4_ = auVar48._0_4_;
              auVar12._6_8_ = SUB148(auVar24 << 0x40,6);
              auVar60._0_4_ = auVar48._0_4_ & 0xffff;
              auVar60._4_10_ = auVar12._4_10_;
              auVar60._14_2_ = 0;
              auVar48 = pmaddwd(auVar60,auVar56);
              iVar31 = auVar48._0_4_ + auVar62._0_4_ + iVar31;
              iVar52 = auVar48._4_4_ + auVar62._4_4_ + iVar52;
              iVar53 = auVar48._8_4_ + auVar62._8_4_ + iVar53;
              iVar54 = auVar48._12_4_ + auVar62._12_4_ + iVar54;
              lVar36 = lVar36 + 4;
            } while (lVar36 != 0x10);
            result = result + (float)(iVar54 + iVar52 + iVar53 + iVar31) *
                              q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar43].d *
                              *(float *)((long)puVar33 + lVar43 * 0x24);
            lVar43 = lVar43 + 1;
            puVar40 = puVar40 + 0x14;
            lVar42 = lVar42 + 0x24;
          } while (lVar43 != 0x2000);
        }
        local_1500 = local_1500 + local_14e8;
        local_14f0 = local_14f0 + dVar47;
        local_14c8 = local_14c8 + dVar47 * dVar47;
        if (dVar47 <= local_1418) {
          dVar47 = local_1418;
        }
        local_1418 = dVar47;
        fVar49 = SUB84(local_1418,0);
        local_14f8 = local_14f8 + (double)result;
        lVar42 = std::chrono::_V2::system_clock::now();
        dVar47 = (double)(lVar42 - lVar32) * 0.001;
        local_1508 = local_1508 + dVar47;
        local_14d0 = local_14d0 + dVar47 * dVar47;
        if (dVar47 <= local_1410) {
          dVar47 = local_1410;
        }
        iVar30 = iVar30 + 1;
        local_1410 = dVar47;
      } while (iVar30 != local_1514);
    }
    dVar3 = (double)local_1514;
    local_14b8 = dVar47;
    printf("Exact result: <dot> = %g\n",local_14c0 / dVar3);
    printf("<dot> = %g, %g\n",local_1500 / dVar3,SUB84(local_14f8 / dVar3,0));
    local_14f0 = local_14f0 / dVar3;
    dVar47 = local_14c8 / dVar3 - local_14f0 * local_14f0;
    uVar50 = SUB84(dVar47,0);
    if (0.0 < dVar47) {
      if (dVar47 < 0.0) {
        dVar47 = sqrt(dVar47);
        uVar50 = SUB84(dVar47,0);
      }
      else {
        uVar50 = SUB84(SQRT(dVar47),0);
      }
    }
    printf("time = %g +/- %g us. maxt = %g us\n",local_14f0,uVar50,SUB84(local_1418,0));
    local_1508 = local_1508 / dVar3;
    dVar47 = local_14d0 / dVar3 - local_1508 * local_1508;
    uVar50 = SUB84(dVar47,0);
    if (0.0 < dVar47) {
      if (dVar47 < 0.0) {
        dVar47 = sqrt(dVar47);
        uVar50 = SUB84(dVar47,0);
      }
      else {
        uVar50 = SUB84(SQRT(dVar47),0);
      }
    }
    printf("timeq = %g +/- %g us. maxt = %g us\n",local_1508,uVar50,SUB84(local_14b8,0));
    operator_delete(puVar33,0x48000);
    if (q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    operator_delete(__s_00,0x100000);
    operator_delete(__s,0x100000);
    iVar30 = 0;
  }
  else {
    puts("It is not possible to use Q4_1 quantization and scalar implementations");
    iVar30 = 1;
  }
  return iVar30;
}

Assistant:

int main(int argc, char** argv) {

    int nloop = argc > 1 ? atoi(argv[1]) : 10;
    bool scalar = argc > 2 ? atoi(argv[2]) : false;
    bool useQ4_1 = argc > 3 ? atoi(argv[3]) : false;

    if (scalar && useQ4_1) {
        printf("It is not possible to use Q4_1 quantization and scalar implementations\n");
        return 1;
    }

    std::mt19937 rndm(1234);

    std::vector<float> x1(kVecSize), y1(kVecSize);
    int n4 = useQ4_1 ? kVecSize / QK4_1 : kVecSize / QK4_0; n4 = 64*((n4 + 63)/64);
    int n8 = kVecSize / QK8_0; n8 = 64*((n8 + 63)/64);

    const auto * funcs_cpu = ggml_get_type_traits_cpu(useQ4_1 ? GGML_TYPE_Q4_1 : GGML_TYPE_Q4_0);

    std::vector<block_q4_0> q40;
    std::vector<block_q4_1> q41;
    if (useQ4_1) q41.resize(n4);
    else q40.resize(n4);
    std::vector<block_q8_0> q8(n8);
    double sumt = 0, sumt2 = 0, maxt = 0;
    double sumqt = 0, sumqt2 = 0, maxqt = 0;
    double sum = 0, sumq = 0, exactSum = 0;
    for (int iloop=0; iloop<nloop; ++iloop) {

        // Fill vector x with random numbers
        fillRandomGaussianFloats(x1, rndm);

        // Fill vector y with random numbers
        fillRandomGaussianFloats(y1, rndm);

        // Compute the exact dot product
        for (int k=0; k<kVecSize; ++k) exactSum += x1[k]*y1[k];

        // quantize x.
        // Note, we do not include this in the timing as in practical application
        // we already have the quantized model weights.
        if (useQ4_1) {
            funcs_cpu->from_float(x1.data(), q41.data(), kVecSize);
        } else {
            funcs_cpu->from_float(x1.data(), q40.data(), kVecSize);
        }

        // Now measure time the dot product needs using the "scalar" version above
        auto t1 = std::chrono::high_resolution_clock::now();
        if (useQ4_1) sum += dot41(kVecSize / QK4_1, q41.data(), y1.data());
        else sum += dot(kVecSize / QK4_0, q40.data(), y1.data());
        auto t2 = std::chrono::high_resolution_clock::now();
        auto t = 1e-3*std::chrono::duration_cast<std::chrono::nanoseconds>(t2-t1).count();
        sumt += t; sumt2 += t*t; maxt = std::max(maxt, t);

        // And now measure the time needed to quantize y and perform the dot product with the quantized y
        t1 = std::chrono::high_resolution_clock::now();
        float result;
        if (scalar) {
            quantize_row_q8_0_reference(y1.data(), q8.data(), kVecSize);
            dot_q4_q8(kVecSize, &result, q40.data(), q8.data());
        }
        else {
            const auto * vdot = ggml_get_type_traits_cpu(funcs_cpu->vec_dot_type);
            vdot->from_float(y1.data(), q8.data(), kVecSize);
            if (useQ4_1) funcs_cpu->vec_dot(kVecSize, &result, 0, q41.data(), 0, q8.data(), 0, 1);
            else funcs_cpu->vec_dot(kVecSize, &result, 0, q40.data(), 0, q8.data(), 0, 1);
        }
        sumq += result;
        t2 = std::chrono::high_resolution_clock::now();
        t = 1e-3*std::chrono::duration_cast<std::chrono::nanoseconds>(t2-t1).count();
        sumqt += t; sumqt2 += t*t; maxqt = std::max(maxqt, t);

    }

    // Report the time (and the average of the dot products so the compiler does not come up with the idea
    // of optimizing away the function calls after figuring that the result is not used).
    sum /= nloop; sumq /= nloop;
    exactSum /= nloop;
    printf("Exact result: <dot> = %g\n",exactSum);
    printf("<dot> = %g, %g\n",sum,sumq);
    sumt /= nloop; sumt2 /= nloop; sumt2 -= sumt*sumt;
    if (sumt2 > 0) sumt2 = sqrt(sumt2);
    printf("time = %g +/- %g us. maxt = %g us\n",sumt,sumt2,maxt);
    sumqt /= nloop; sumqt2 /= nloop; sumqt2 -= sumqt*sumqt;
    if (sumqt2 > 0) sumqt2 = sqrt(sumqt2);
    printf("timeq = %g +/- %g us. maxt = %g us\n",sumqt,sumqt2,maxqt);
    return 0;
}